

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

nng_err nng_pipe_notify(nng_socket s,nng_pipe_ev ev,nng_pipe_cb cb,void *arg)

{
  nng_err nVar1;
  nni_sock *in_RAX;
  nni_sock *local_28;
  nni_sock *sock;
  
  local_28 = in_RAX;
  nVar1 = nni_sock_find(&local_28,s.id);
  if (nVar1 == NNG_OK) {
    nni_sock_set_pipe_cb(local_28,ev,cb,arg);
    nni_sock_rele(local_28);
    nVar1 = NNG_OK;
  }
  return nVar1;
}

Assistant:

nng_err
nng_pipe_notify(nng_socket s, nng_pipe_ev ev, nng_pipe_cb cb, void *arg)
{
	nng_err   rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}

	nni_sock_set_pipe_cb(sock, ev, cb, arg);
	nni_sock_rele(sock);
	return (NNG_OK);
}